

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_detector.cc
# Opt level: O2

float __thiscall
webrtc::TransientDetector::ReferenceDetectionValue
          (TransientDetector *this,float *data,size_t length)

{
  float fVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = 1.0;
  if (data != (float *)0x0) {
    fVar5 = 0.0;
    for (uVar3 = 1; uVar3 < length; uVar3 = uVar3 + 1) {
      fVar5 = fVar5 + data[uVar3] * data[uVar3];
    }
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      fVar1 = this->reference_energy_;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        __assert_fail("reference_energy_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_detector.cc"
                      ,0xa3,
                      "float webrtc::TransientDetector::ReferenceDetectionValue(const float *, size_t)"
                     );
      }
      fVar4 = expf((0.2 - fVar5 / fVar1) * 20.0);
      fVar4 = 1.0 / (fVar4 + 1.0);
      this->reference_energy_ = fVar1 * 0.99 + fVar5 * 0.00999999;
      bVar2 = true;
      goto LAB_00189846;
    }
  }
  bVar2 = false;
LAB_00189846:
  this->using_reference_ = bVar2;
  return fVar4;
}

Assistant:

float TransientDetector::ReferenceDetectionValue(const float* data,
                                                 size_t length) {
  if (data == NULL) {
    using_reference_ = false;
    return 1.f;
  }
  static const float kEnergyRatioThreshold = 0.2f;
  static const float kReferenceNonLinearity = 20.f;
  static const float kMemory = 0.99f;
  float reference_energy = 0.f;
  for (size_t i = 1; i < length; ++i) {
    reference_energy += data[i] * data[i];
  }
  if (reference_energy == 0.f) {
    using_reference_ = false;
    return 1.f;
  }
  assert(reference_energy_ != 0);
  float result = 1.f / (1.f + exp(kReferenceNonLinearity *
                                  (kEnergyRatioThreshold -
                                   reference_energy / reference_energy_)));
  reference_energy_ =
      kMemory * reference_energy_ + (1.f - kMemory) * reference_energy;

  using_reference_ = true;

  return result;
}